

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

QByteArray * __thiscall QWidget::saveGeometry(QByteArray *__return_storage_ptr__,QWidget *this)

{
  long lVar1;
  long *plVar2;
  int iVar3;
  QScreen *pQVar4;
  QDataStream *pQVar5;
  int extraout_EDX;
  long lVar6;
  long unaff_R12;
  long in_FS_OFFSET;
  QRect local_80;
  QRect local_70;
  long local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_58,__return_storage_ptr__,2);
  uStack_40 = 7;
  QGuiApplication::screens();
  pQVar4 = screen(this);
  if (local_60 != 0) {
    lVar6 = -8;
    do {
      iVar3 = (int)unaff_R12;
      lVar1 = local_60 * -8 + lVar6;
      if (lVar1 == -8) goto LAB_00308985;
      unaff_R12 = lVar6 + 8;
      plVar2 = (long *)(local_70._8_8_ + 8 + lVar6);
      lVar6 = unaff_R12;
    } while ((QScreen *)*plVar2 != pQVar4);
    iVar3 = (int)(unaff_R12 >> 3);
LAB_00308985:
    if (lVar1 != -8) goto LAB_00308992;
  }
  iVar3 = -1;
LAB_00308992:
  if ((QArrayData *)local_70._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_70._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_70._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_70._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_70._0_8_,8,0x10);
    }
  }
  pQVar5 = (QDataStream *)QDataStream::operator<<((QDataStream *)&local_58,0x1d9d0cb);
  pQVar5 = (QDataStream *)QDataStream::operator<<(pQVar5,3);
  pQVar5 = (QDataStream *)QDataStream::operator<<(pQVar5,0);
  local_70 = frameGeometry(this);
  pQVar5 = (QDataStream *)::operator<<(pQVar5,&local_70);
  local_80 = normalGeometry(this);
  pQVar5 = (QDataStream *)::operator<<(pQVar5,&local_80);
  pQVar5 = (QDataStream *)QDataStream::operator<<(pQVar5,iVar3);
  pQVar5 = (QDataStream *)QDataStream::operator<<(pQVar5,*(uint *)&this->data->field_0x10 & 2);
  pQVar5 = (QDataStream *)QDataStream::operator<<(pQVar5,*(uint *)&this->data->field_0x10 & 4);
  screen(this);
  iVar3 = QScreen::geometry();
  pQVar5 = (QDataStream *)QDataStream::operator<<(pQVar5,(extraout_EDX - iVar3) + 1);
  ::operator<<(pQVar5,&this->data->crect);
  QDataStream::~QDataStream((QDataStream *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QWidget::saveGeometry() const
{
    QByteArray array;
    QDataStream stream(&array, QIODevice::WriteOnly);
    stream.setVersion(QDataStream::Qt_4_0);
    const quint32 magicNumber = 0x1D9D0CB;
    // Version history:
    // - Qt 4.2 - 4.8.6, 5.0 - 5.3    : Version 1.0
    // - Qt 4.8.6 - today, 5.4 - today: Version 2.0, save screen width in addition to check for high DPI scaling.
    // - Qt 5.12 - today              : Version 3.0, save QWidget::geometry()
    quint16 majorVersion = 3;
    quint16 minorVersion = 0;
    const int screenNumber = QGuiApplication::screens().indexOf(screen());
    stream << magicNumber
           << majorVersion
           << minorVersion
           << frameGeometry()
           << normalGeometry()
           << qint32(screenNumber)
           << quint8(windowState() & Qt::WindowMaximized)
           << quint8(windowState() & Qt::WindowFullScreen)
           << qint32(screen()->geometry().width()) // added in 2.0
           << geometry(); // added in 3.0
    return array;
}